

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask10_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 10 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0x14 | uVar1;
  *out = uVar1;
  uVar2 = in[3];
  *out = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[1] = uVar2;
  uVar2 = in[4] << 8 | uVar2;
  out[1] = uVar2;
  uVar2 = in[5] << 0x12 | uVar2;
  out[1] = uVar2;
  uVar1 = in[6];
  out[1] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[2] = uVar1;
  out[2] = in[7] << 6 | uVar1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask10_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;

  return out + 1;
}